

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# energy.c
# Opt level: O3

int32_t WebRtcSpl_Energy(int16_t *vector,size_t vector_length,int *scale_factor)

{
  int16_t iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar1 = WebRtcSpl_GetScalingSquare(vector,vector_length,vector_length);
  iVar2 = 0;
  if (vector_length != 0) {
    sVar3 = 0;
    do {
      iVar2 = iVar2 + ((uint)((int)vector[sVar3] * (int)vector[sVar3]) >> ((byte)iVar1 & 0x1f));
      sVar3 = sVar3 + 1;
    } while (vector_length != sVar3);
  }
  *scale_factor = (int)iVar1;
  return iVar2;
}

Assistant:

int32_t WebRtcSpl_Energy(int16_t* vector,
                         size_t vector_length,
                         int* scale_factor)
{
    int32_t en = 0;
    size_t i;
    int scaling =
        WebRtcSpl_GetScalingSquare(vector, vector_length, vector_length);
    size_t looptimes = vector_length;
    int16_t *vectorptr = vector;

    for (i = 0; i < looptimes; i++)
    {
      en += (*vectorptr * *vectorptr) >> scaling;
      vectorptr++;
    }
    *scale_factor = scaling;

    return en;
}